

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_helper.c
# Opt level: O2

hwaddr riscv_cpu_get_phys_page_debug_riscv32(CPUState_conflict *cs,vaddr addr)

{
  _Bool two_stage;
  int iVar1;
  int iVar2;
  hwaddr hVar3;
  int prot;
  hwaddr phys_addr;
  
  iVar2 = *(int *)(cs[1].tb_jmp_cache + 0x174);
  if ((*(byte *)((long)cs[1].tb_jmp_cache + 0xb94) & 0x80) == 0) {
    two_stage = false;
  }
  else {
    two_stage = (_Bool)(*(byte *)((long)cs[1].tb_jmp_cache + 0xba4) & 1);
  }
  iVar1 = get_physical_address
                    ((CPURISCVState_conflict *)(cs[1].tb_jmp_cache + 0x13f),&phys_addr,&prot,
                     (target_ulong_conflict)addr,0,iVar2,true,two_stage);
  hVar3 = 0xffffffffffffffff;
  if (iVar1 == 0) {
    if ((((*(byte *)((long)cs[1].tb_jmp_cache + 0xb94) & 0x80) != 0) &&
        ((*(byte *)((long)cs[1].tb_jmp_cache + 0xba4) & 1) != 0)) &&
       (iVar2 = get_physical_address
                          ((CPURISCVState_conflict *)(cs[1].tb_jmp_cache + 0x13f),&phys_addr,&prot,
                           (target_ulong_conflict)phys_addr,0,iVar2,false,true), iVar2 != 0)) {
      return 0xffffffffffffffff;
    }
    hVar3 = CONCAT44(phys_addr._4_4_,(target_ulong_conflict)phys_addr);
  }
  return hVar3;
}

Assistant:

hwaddr riscv_cpu_get_phys_page_debug(CPUState *cs, vaddr addr)
{
    RISCVCPU *cpu = RISCV_CPU(cs);
    CPURISCVState *env = &cpu->env;
    hwaddr phys_addr;
    int prot;
    int mmu_idx = cpu_mmu_index(&cpu->env, false);

    if (get_physical_address(env, &phys_addr, &prot, addr, 0, mmu_idx,
                             true, riscv_cpu_virt_enabled(env))) {
        return -1;
    }

    if (riscv_cpu_virt_enabled(env)) {
        if (get_physical_address(env, &phys_addr, &prot, phys_addr,
                                 0, mmu_idx, false, true)) {
            return -1;
        }
    }

    return phys_addr;
}